

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglGLES2SharingThreadedTests.cpp
# Opt level: O2

IterateResult __thiscall
deqp::egl::GLES2ThreadedSharingTest::iterate(GLES2ThreadedSharingTest *this)

{
  ostringstream *poVar1;
  EGLThread *this_00;
  bool bVar2;
  TestLog *pTVar3;
  int iVar4;
  pointer ppEVar5;
  deUint64 dVar6;
  NotSupportedError *this_01;
  pointer ppEVar7;
  ulong uVar8;
  ulong uVar9;
  char *description;
  bool bVar10;
  int iVar11;
  long lVar12;
  int threadNdx;
  ulong uVar13;
  int threadNdx_3;
  uint uVar14;
  vector<int,_std::allocator<int>_> indices;
  Message message;
  MessageBuilder local_1b0;
  
  if (this->m_threadsStarted == false) {
    dVar6 = deGetMicroseconds();
    this->m_beginTimeUs = dVar6;
    for (lVar12 = 0;
        ppEVar5 = (this->m_threads).
                  super__Vector_base<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
                  ._M_impl.super__Vector_impl_data._M_start,
        lVar12 < (int)((ulong)((long)(this->m_threads).
                                     super__Vector_base<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
                                     ._M_impl.super__Vector_impl_data._M_finish - (long)ppEVar5) >>
                      3); lVar12 = lVar12 + 1) {
      tcu::ThreadUtil::Thread::exec(&ppEVar5[lVar12]->super_Thread);
    }
    this->m_threadsStarted = true;
    this->m_threadsRunning = true;
  }
  else if ((this->m_threadsRunning & 1U) == 0) goto LAB_001f1105;
  ppEVar5 = (this->m_threads).
            super__Vector_base<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  ppEVar7 = (this->m_threads).
            super__Vector_base<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  uVar13 = (ulong)((long)ppEVar7 - (long)ppEVar5) >> 3;
  uVar8 = 0;
  iVar4 = (int)uVar13;
  uVar9 = 0;
  if (0 < iVar4) {
    uVar9 = uVar13 & 0xffffffff;
  }
  iVar11 = 0;
  for (; uVar9 != uVar8; uVar8 = uVar8 + 1) {
    iVar11 = iVar11 + (uint)((ppEVar5[uVar8]->super_Thread).m_status != THREADSTATUS_RUNNING);
  }
  if (iVar11 == iVar4) {
    for (lVar12 = 0; lVar12 < (int)((ulong)((long)ppEVar7 - (long)ppEVar5) >> 3);
        lVar12 = lVar12 + 1) {
      de::Thread::join((Thread *)ppEVar5[lVar12]);
      ppEVar5 = (this->m_threads).
                super__Vector_base<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
      ppEVar7 = (this->m_threads).
                super__Vector_base<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    }
    this->m_executionReady = true;
    this->m_requiresRestart = false;
  }
  dVar6 = deGetMicroseconds();
  if (this->m_timeOutUs < dVar6 - this->m_beginTimeUs) {
    lVar12 = 0;
    while( true ) {
      ppEVar5 = (this->m_threads).
                super__Vector_base<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
      if ((int)((ulong)((long)(this->m_threads).
                              super__Vector_base<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)ppEVar5) >> 3) <=
          lVar12) break;
      this_00 = ppEVar5[lVar12];
      if ((this_00->super_Thread).m_status != THREADSTATUS_RUNNING) {
        de::Thread::join((Thread *)this_00);
      }
      lVar12 = lVar12 + 1;
    }
    this->m_executionReady = true;
    this->m_requiresRestart = true;
    dVar6 = deGetMicroseconds();
    this->m_timeOutTimeUs = dVar6;
  }
  else {
    deSleep(this->m_sleepTimeMs);
  }
LAB_001f1105:
  if (this->m_executionReady != true) {
    return CONTINUE;
  }
  local_1b0.m_log = (TestLog *)((ulong)local_1b0.m_log._4_4_ << 0x20);
  std::vector<int,_std::allocator<int>_>::vector
            (&indices,(long)(this->m_threads).
                            super__Vector_base<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(this->m_threads).
                            super__Vector_base<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 3,
             (value_type_conflict1 *)&local_1b0,(allocator_type *)&message);
  if (this->m_timeOutTimeUs != 0) {
    local_1b0.m_log = this->m_log;
    poVar1 = &local_1b0.m_str;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
    std::operator<<((ostream *)poVar1,
                    "Execution timeout limit reached. Trying to get per thread logs. This is potentially dangerous."
                   );
    tcu::MessageBuilder::operator<<(&local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar1);
  }
LAB_001f1185:
  uVar14 = 0;
  do {
    ppEVar5 = (this->m_threads).
              super__Vector_base<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if ((int)((ulong)((long)(this->m_threads).
                            super__Vector_base<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)ppEVar5) >> 3) <=
        (int)uVar14) {
      if (this->m_timeOutTimeUs != 0) {
        local_1b0.m_log = this->m_log;
        poVar1 = &local_1b0.m_str;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
        std::operator<<((ostream *)poVar1,"[");
        std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
        std::operator<<((ostream *)poVar1,"] Execution timeout limit reached");
        tcu::MessageBuilder::operator<<(&local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar1);
      }
      ppEVar5 = (this->m_threads).
                super__Vector_base<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
      uVar8 = (ulong)((long)(this->m_threads).
                            super__Vector_base<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)ppEVar5) >> 3;
      uVar9 = 0;
      uVar13 = uVar8 & 0xffffffff;
      if ((int)uVar8 < 1) {
        uVar13 = uVar9;
      }
      bVar2 = true;
      bVar10 = false;
      for (; uVar13 != uVar9; uVar9 = uVar9 + 1) {
        switch((ppEVar5[uVar9]->super_Thread).m_status) {
        default:
          bVar2 = false;
          break;
        case THREADSTATUS_READY:
          break;
        case THREADSTATUS_NOT_SUPPORTED:
          bVar10 = true;
        }
      }
      if (!bVar10) {
        description = "Fail";
        if (bVar2) {
          description = "Pass";
        }
        tcu::TestContext::setTestResult
                  ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,(uint)(byte)~bVar2
                   ,description);
        std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                  (&indices.super__Vector_base<int,_std::allocator<int>_>);
        return STOP;
      }
      this_01 = (NotSupportedError *)__cxa_allocate_exception(0x38);
      tcu::NotSupportedError::NotSupportedError
                (this_01,"Thread threw tcu::NotSupportedError","",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingThreadedTests.cpp"
                 ,0xea5);
      __cxa_throw(this_01,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
    }
    iVar4 = tcu::ThreadUtil::Thread::getMessageCount(&ppEVar5[uVar14]->super_Thread);
    if (indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start[uVar14] < iVar4) break;
    uVar14 = uVar14 + 1;
  } while( true );
  lVar12 = 0;
  while( true ) {
    ppEVar5 = (this->m_threads).
              super__Vector_base<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if ((int)((ulong)((long)(this->m_threads).
                            super__Vector_base<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)ppEVar5) >> 3) <=
        lVar12) break;
    iVar4 = tcu::ThreadUtil::Thread::getMessageCount(&ppEVar5[lVar12]->super_Thread);
    if (indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start[lVar12] < iVar4) {
      tcu::ThreadUtil::Thread::getMessage
                ((Message *)&local_1b0,
                 &(this->m_threads).
                  super__Vector_base<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
                  ._M_impl.super__Vector_impl_data._M_start[lVar12]->super_Thread,
                 indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar12]);
      pTVar3 = local_1b0.m_log;
      dVar6 = this->m_beginTimeUs;
      tcu::ThreadUtil::Thread::getMessage
                (&message,&(this->m_threads).
                           super__Vector_base<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
                           ._M_impl.super__Vector_impl_data._M_start[(int)uVar14]->super_Thread,
                 indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start[(int)uVar14]);
      uVar13 = message.m_time - this->m_beginTimeUs;
      std::__cxx11::string::~string((string *)&message.m_message);
      std::__cxx11::string::~string((string *)&local_1b0.m_str);
      if ((long)pTVar3 - dVar6 < uVar13) {
        uVar14 = (uint)lVar12;
      }
    }
    lVar12 = lVar12 + 1;
  }
  tcu::ThreadUtil::Thread::getMessage
            (&message,&ppEVar5[(int)uVar14]->super_Thread,
             indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start[(int)uVar14]);
  local_1b0.m_log = this->m_log;
  poVar1 = &local_1b0.m_str;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
  std::operator<<((ostream *)poVar1,"[");
  std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::operator<<((ostream *)poVar1,"] (");
  std::ostream::operator<<(poVar1,uVar14);
  std::operator<<((ostream *)poVar1,") ");
  std::operator<<((ostream *)poVar1,(string *)&message.m_message);
  tcu::MessageBuilder::operator<<(&local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar1);
  indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
  [(int)uVar14] =
       indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_start[(int)uVar14] + 1;
  std::__cxx11::string::~string((string *)&message.m_message);
  goto LAB_001f1185;
}

Assistant:

tcu::TestCase::IterateResult GLES2ThreadedSharingTest::iterate (void)
{
	if (!m_threadsStarted)
	{
		m_beginTimeUs = deGetMicroseconds();

		// Execute threads
		for (int threadNdx = 0; threadNdx < (int)m_threads.size(); threadNdx++)
			m_threads[threadNdx]->exec();

		m_threadsStarted = true;
		m_threadsRunning = true;
	}

	if (m_threadsRunning)
	{
		// Wait threads to finish
		int readyThreads = 0;
		for (int threadNdx = 0; threadNdx < (int)m_threads.size(); threadNdx++)
		{
			if (m_threads[threadNdx]->getStatus() != tcu::ThreadUtil::Thread::THREADSTATUS_RUNNING)
				readyThreads++;
		}

		if (readyThreads == (int)m_threads.size())
		{
			for (int threadNdx = 0; threadNdx < (int)m_threads.size(); threadNdx++)
				m_threads[threadNdx]->join();

			m_executionReady	= true;
			m_requiresRestart	= false;
		}

		if (deGetMicroseconds() - m_beginTimeUs > m_timeOutUs)
		{
			for (int threadNdx = 0; threadNdx < (int)m_threads.size(); threadNdx++)
			{
				if (m_threads[threadNdx]->getStatus() != tcu::ThreadUtil::Thread::THREADSTATUS_RUNNING)
					m_threads[threadNdx]->join();
			}
			m_executionReady	= true;
			m_requiresRestart	= true;
			m_timeOutTimeUs		= deGetMicroseconds();
		}
		else
		{
			deSleep(m_sleepTimeMs);
		}
	}

	if (m_executionReady)
	{
		std::vector<int> indices(m_threads.size(), 0);

		if (m_timeOutTimeUs != 0)
			m_log << tcu::TestLog::Message << "Execution timeout limit reached. Trying to get per thread logs. This is potentially dangerous." << tcu::TestLog::EndMessage;

		while (true)
		{
			int			firstThread = -1;

			// Find first thread with messages
			for (int threadNdx = 0; threadNdx < (int)m_threads.size(); threadNdx++)
			{
				if (m_threads[threadNdx]->getMessageCount() > indices[threadNdx])
				{
					firstThread = threadNdx;
					break;
				}
			}

			// No more messages
			if (firstThread == -1)
				break;

			for (int threadNdx = 0; threadNdx < (int)m_threads.size(); threadNdx++)
			{
				// No more messages in this thread
				if (m_threads[threadNdx]->getMessageCount() <= indices[threadNdx])
					continue;

				if ((m_threads[threadNdx]->getMessage(indices[threadNdx]).getTime() - m_beginTimeUs) < (m_threads[firstThread]->getMessage(indices[firstThread]).getTime() - m_beginTimeUs))
					firstThread = threadNdx;
			}

			tcu::ThreadUtil::Message message = m_threads[firstThread]->getMessage(indices[firstThread]);

			m_log << tcu::TestLog::Message << "[" << (message.getTime() - m_beginTimeUs) << "] (" << firstThread << ") " << message.getMessage() << tcu::TestLog::EndMessage;
			indices[firstThread]++;
		}

		if (m_timeOutTimeUs != 0)
			m_log << tcu::TestLog::Message << "[" << (m_timeOutTimeUs - m_beginTimeUs) << "] Execution timeout limit reached" << tcu::TestLog::EndMessage;

		bool isOk = true;
		bool notSupported = false;

		for (int threadNdx = 0; threadNdx < (int)m_threads.size(); threadNdx++)
		{
			const tcu::ThreadUtil::Thread::ThreadStatus status = m_threads[threadNdx]->getStatus();

			switch (status)
			{
				case tcu::ThreadUtil::Thread::THREADSTATUS_FAILED:
				case tcu::ThreadUtil::Thread::THREADSTATUS_INIT_FAILED:
				case tcu::ThreadUtil::Thread::THREADSTATUS_RUNNING:
					isOk = false;
					break;

				case tcu::ThreadUtil::Thread::THREADSTATUS_NOT_SUPPORTED:
					notSupported = true;
					break;

				case tcu::ThreadUtil::Thread::THREADSTATUS_READY:
					// Nothing
					break;

				default:
					DE_ASSERT(false);
					isOk = false;
			};
		}

		if (notSupported)
			throw tcu::NotSupportedError("Thread threw tcu::NotSupportedError", "", __FILE__, __LINE__);

		if (isOk)
			m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
		else
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");

		return STOP;
	}

	return CONTINUE;
}